

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<unsigned_short,long_long>(void)

{
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> bits;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> bits_00;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_00;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> i;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_01;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_02;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_03;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_04;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_05;
  longlong u2;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> st;
  bool b;
  unsigned_short t;
  longlong u;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffdd8
  ;
  undefined2 in_stack_fffffffffffffde0;
  undefined2 in_stack_fffffffffffffde2;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffde4;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffde6;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffde8
  ;
  undefined4 in_stack_fffffffffffffdf0;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_fffffffffffffdf4;
  undefined2 in_stack_fffffffffffffdf6;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffdf8
  ;
  unsigned_short local_1a;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_18;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_e;
  byte local_b;
  unsigned_short local_a;
  longlong local_8;
  
  local_8 = 0;
  local_a = 0;
  local_b = 0;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<long_long>
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             (longlong *)in_stack_fffffffffffffdd8.m_int);
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            (&local_18,&local_8);
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<long_long>
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffdf6,
                      CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffde8.m_int);
  local_b = (local_b ^ 0xff) & 1;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffdf6,
                      CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             (unsigned_short *)in_stack_fffffffffffffde8.m_int);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffdf6,
                      CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             (longlong *)in_stack_fffffffffffffde8.m_int);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdd8.m_int);
  local_e.m_int = local_1a;
  SafeInt::operator_cast_to_long_long
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffde8.m_int,
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator*(in_stack_fffffffffffffdd8.m_int,in_stack_fffffffffffffde4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             in_stack_fffffffffffffdd8.m_int);
  rhs.m_int._2_2_ = in_stack_fffffffffffffde2;
  rhs.m_int._0_2_ = in_stack_fffffffffffffde0;
  rhs.m_int._4_2_ = in_stack_fffffffffffffde4.m_int;
  rhs.m_int._6_2_ = in_stack_fffffffffffffde6.m_int;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdd8.m_int,rhs);
  local_8 = 1;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffdf6,
                      CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffdf6,
                      CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffde8.m_int,
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffdf6,
                      CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             in_stack_fffffffffffffdd8.m_int);
  rhs_00.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  rhs_00.m_int._0_4_ = in_stack_fffffffffffffdf0;
  rhs_00.m_int._6_2_ = in_stack_fffffffffffffdf6;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffde8.m_int,rhs_00);
  local_8 = 1;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffdf6,
                      CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffdf6,
                      CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffde8.m_int,
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator/(in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             in_stack_fffffffffffffdd8.m_int);
  i.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  i.m_int._0_4_ = in_stack_fffffffffffffdf0;
  i.m_int._6_2_ = in_stack_fffffffffffffdf6;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffde8.m_int,i);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffde8.m_int,
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator+(in_stack_fffffffffffffdd8.m_int,in_stack_fffffffffffffde4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             in_stack_fffffffffffffdd8.m_int);
  rhs_01.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  rhs_01.m_int._0_4_ = in_stack_fffffffffffffdf0;
  rhs_01.m_int._6_2_ = in_stack_fffffffffffffdf6;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffde8.m_int,rhs_01);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffdf6,
                      CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             (int *)in_stack_fffffffffffffde8.m_int);
  local_8 = 0;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffdf6,
                      CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffde8.m_int,
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffde8.m_int,in_stack_fffffffffffffdf4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator-(in_stack_fffffffffffffdd8.m_int,in_stack_fffffffffffffde4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             in_stack_fffffffffffffdd8.m_int);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffdf6,
                      CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffdf6,
                      CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             (int *)in_stack_fffffffffffffde8.m_int);
  rhs_02.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  rhs_02.m_int._0_4_ = in_stack_fffffffffffffdf0;
  rhs_02.m_int._6_2_ = in_stack_fffffffffffffdf6;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffde8.m_int,rhs_02);
  local_8 = 1;
  SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffdf6,
                      CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             (int *)in_stack_fffffffffffffde8.m_int);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffde8.m_int,
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffdf6,
                      CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             in_stack_fffffffffffffdf8);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator<<(0,in_stack_fffffffffffffdd8);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             in_stack_fffffffffffffdd8.m_int);
  bits.m_int._2_2_ = in_stack_fffffffffffffde2;
  bits.m_int._0_2_ = in_stack_fffffffffffffde0;
  bits.m_int._4_2_ = in_stack_fffffffffffffde4.m_int;
  bits.m_int._6_2_ = in_stack_fffffffffffffde6.m_int;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdd8.m_int,bits);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffde8.m_int,
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffdf6,
                      CONCAT24(in_stack_fffffffffffffdf4.m_int,in_stack_fffffffffffffdf0)),
             in_stack_fffffffffffffdf8);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator>>(0,in_stack_fffffffffffffdd8);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             in_stack_fffffffffffffdd8.m_int);
  bits_00.m_int._2_2_ = in_stack_fffffffffffffde2;
  bits_00.m_int._0_2_ = in_stack_fffffffffffffde0;
  bits_00.m_int._4_2_ = in_stack_fffffffffffffde4.m_int;
  bits_00.m_int._6_2_ = in_stack_fffffffffffffde6.m_int;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdd8.m_int,bits_00);
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdd8.m_int,in_stack_fffffffffffffde4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffde8.m_int,
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator&(in_stack_fffffffffffffde6.m_int,in_stack_fffffffffffffde8);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffde6.m_int,
                                CONCAT24(in_stack_fffffffffffffde4.m_int,
                                         CONCAT22(in_stack_fffffffffffffde2,
                                                  in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdd8.m_int,in_stack_fffffffffffffde6);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             in_stack_fffffffffffffdd8.m_int);
  rhs_03.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  rhs_03.m_int._0_4_ = in_stack_fffffffffffffdf0;
  rhs_03.m_int._6_2_ = in_stack_fffffffffffffdf6;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffde8.m_int,rhs_03);
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdd8.m_int,in_stack_fffffffffffffde4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffde8.m_int,
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator|(in_stack_fffffffffffffde6.m_int,in_stack_fffffffffffffde8);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffde6.m_int,
                                CONCAT24(in_stack_fffffffffffffde4.m_int,
                                         CONCAT22(in_stack_fffffffffffffde2,
                                                  in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdd8.m_int,in_stack_fffffffffffffde6);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             in_stack_fffffffffffffdd8.m_int);
  rhs_04.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  rhs_04.m_int._0_4_ = in_stack_fffffffffffffdf0;
  rhs_04.m_int._6_2_ = in_stack_fffffffffffffdf6;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffde8.m_int,rhs_04);
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdd8.m_int,in_stack_fffffffffffffde4);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffde8.m_int,
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))));
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffde6.m_int,
                                   CONCAT24(in_stack_fffffffffffffde4.m_int,
                                            CONCAT22(in_stack_fffffffffffffde2,
                                                     in_stack_fffffffffffffde0))));
  operator^(in_stack_fffffffffffffde6.m_int,in_stack_fffffffffffffde8);
  local_a = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffde6.m_int,
                                CONCAT24(in_stack_fffffffffffffde4.m_int,
                                         CONCAT22(in_stack_fffffffffffffde2,
                                                  in_stack_fffffffffffffde0))));
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffdd8.m_int,in_stack_fffffffffffffde6);
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffde6.m_int,
                      CONCAT24(in_stack_fffffffffffffde4.m_int,
                               CONCAT22(in_stack_fffffffffffffde2,in_stack_fffffffffffffde0))),
             in_stack_fffffffffffffdd8.m_int);
  rhs_05.m_int._4_2_ = in_stack_fffffffffffffdf4.m_int;
  rhs_05.m_int._0_4_ = in_stack_fffffffffffffdf0;
  rhs_05.m_int._6_2_ = in_stack_fffffffffffffdf6;
  SafeInt<unsigned_short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             in_stack_fffffffffffffde8.m_int,rhs_05);
  local_b = operator<(in_stack_fffffffffffffde6,in_stack_fffffffffffffdd8);
  local_b = operator<(in_stack_fffffffffffffde6,in_stack_fffffffffffffdd8.m_int);
  local_b = operator<(in_stack_fffffffffffffdd8.m_int,in_stack_fffffffffffffde6);
  local_b = operator<(in_stack_fffffffffffffde6,in_stack_fffffffffffffdd8);
  local_b = operator<=(in_stack_fffffffffffffde6,in_stack_fffffffffffffdd8);
  local_b = operator<=(in_stack_fffffffffffffde6,in_stack_fffffffffffffdd8.m_int);
  local_b = operator<=(in_stack_fffffffffffffdd8.m_int,in_stack_fffffffffffffde6);
  local_b = operator<=(in_stack_fffffffffffffde6,in_stack_fffffffffffffdd8);
  local_b = operator>(in_stack_fffffffffffffde6,in_stack_fffffffffffffdd8);
  local_b = operator>(in_stack_fffffffffffffde6,in_stack_fffffffffffffdd8.m_int);
  local_b = operator>(in_stack_fffffffffffffdd8.m_int,in_stack_fffffffffffffde6);
  local_b = operator>(in_stack_fffffffffffffde6,in_stack_fffffffffffffdd8);
  local_b = operator>=(in_stack_fffffffffffffde6,in_stack_fffffffffffffdd8);
  local_b = operator>=(in_stack_fffffffffffffde6,in_stack_fffffffffffffdd8.m_int);
  local_b = operator>=(in_stack_fffffffffffffdd8.m_int,in_stack_fffffffffffffde6);
  local_b = operator>=(in_stack_fffffffffffffde6,in_stack_fffffffffffffdd8);
  local_b = operator==(in_stack_fffffffffffffde6,in_stack_fffffffffffffdd8);
  lhs.m_int = local_e.m_int;
  local_b = operator==(local_e,in_stack_fffffffffffffdd8.m_int);
  local_b = operator==(in_stack_fffffffffffffdd8.m_int,lhs);
  operator==(lhs,local_18);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}